

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTessellation.cpp
# Opt level: O1

void __thiscall
glcts::TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::initRun
          (TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID *this,_run *run
          ,_tessellation_primitive_mode primitive_mode,GLint n_patch_vertices,bool is_indiced,
          GLint n_instances,uint drawcall_count_multiplier)

{
  char cVar1;
  int iVar2;
  GLuint GVar3;
  deUint32 dVar4;
  uint uVar5;
  undefined4 extraout_var;
  void *__s;
  TestError *this_00;
  uint uVar7;
  uint uVar8;
  char *pcVar9;
  undefined7 in_register_00000081;
  ulong __n;
  GLint link_status;
  char *te_body_raw_ptr;
  char *tc_body_raw_ptr;
  GLfloat tess_levels [4];
  string te_body;
  string tc_body;
  GLuint shader_ids [2];
  char *varyings [5];
  int local_d4;
  TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID *local_d0;
  pointer local_c8;
  pointer local_c0;
  char local_b8 [24];
  string local_a0;
  string local_80;
  GLuint local_60;
  GLuint local_5c;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  char *local_48;
  char *pcStack_40;
  char *local_38;
  long lVar6;
  
  run->drawcall_count_multiplier = drawcall_count_multiplier;
  local_d0 = (TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID *)
             CONCAT44(local_d0._4_4_,(int)CONCAT71(in_register_00000081,is_indiced));
  run->drawcall_is_indiced = is_indiced;
  run->n_instances = n_instances;
  run->n_patch_vertices = n_patch_vertices;
  run->primitive_mode = primitive_mode;
  iVar2 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar2);
  GVar3 = (**(code **)(lVar6 + 0x3c8))();
  run->po_id = GVar3;
  dVar4 = (**(code **)(lVar6 + 0x800))();
  pcVar9 = "glCreateProgram() failed";
  glu::checkError(dVar4,"glCreateProgram() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x481);
  getTCCode_abi_cxx11_
            (&local_80,
             (TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID *)pcVar9,
             n_patch_vertices);
  local_c0 = local_80._M_dataplus._M_p;
  GVar3 = (**(code **)(lVar6 + 0x3f0))((this->super_TestCaseBase).m_glExtTokens.TESS_CONTROL_SHADER)
  ;
  run->tc_id = GVar3;
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"glCreateShader() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x488);
  TestCaseBase::shaderSourceSpecialized(&this->super_TestCaseBase,run->tc_id,1,&local_c0);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  pcVar9 = "glShaderSource() failed for tessellation control shader";
  glu::checkError(dVar4,"glShaderSource() failed for tessellation control shader",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x48b);
  getTECode_abi_cxx11_
            (&local_a0,
             (TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID *)pcVar9,
             primitive_mode);
  local_c8 = local_a0._M_dataplus._M_p;
  GVar3 = (**(code **)(lVar6 + 0x3f0))
                    ((this->super_TestCaseBase).m_glExtTokens.TESS_EVALUATION_SHADER);
  run->te_id = GVar3;
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"glCreateShader() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x492);
  TestCaseBase::shaderSourceSpecialized(&this->super_TestCaseBase,run->te_id,1,&local_c8);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"glShaderSource() failed for tessellation evaluation shader",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x495);
  local_60 = run->tc_id;
  local_5c = run->te_id;
  TessellationShaderUtils::compileShaders(this->m_utils_ptr,2,&local_60,true);
  (**(code **)(lVar6 + 0x10))(run->po_id,this->m_fs_id);
  (**(code **)(lVar6 + 0x10))(run->po_id,run->te_id);
  (**(code **)(lVar6 + 0x10))(run->po_id,this->m_vs_id);
  (**(code **)(lVar6 + 0x10))(run->po_id,run->tc_id);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"glAttachShader() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x4a3);
  local_38 = "te_primitive_id";
  local_48 = "te_tc_primitive_id";
  pcStack_40 = "te_patch_vertices_in";
  local_58 = 0x1baa8c0;
  uStack_54 = 0;
  uStack_50 = 0x1baa8d4;
  uStack_4c = 0;
  (**(code **)(lVar6 + 0x14c8))(run->po_id,5,&local_58,0x8c8c);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"glTransformFeedbackVaryings() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x4ab);
  local_d4 = 0;
  (**(code **)(lVar6 + 0xce8))(run->po_id);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"glLinkProgram() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x4b1);
  (**(code **)(lVar6 + 0x9d8))(run->po_id,0x8b82,&local_d4);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"glGetProgramiv() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x4b4);
  if (local_d4 == 1) {
    if ((char)local_d0 != '\0') {
      (**(code **)(lVar6 + 0x6c8))(1,run);
      dVar4 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar4,"glGenBuffers() failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                      ,0x4c2);
      local_b8[0] = 1;
      local_d0 = this;
      (**(code **)(lVar6 + 0x798))(0x8221);
      dVar4 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar4,
                      "glGetIntegerv() failed for GL_PRIMITIVE_RESTART_FOR_PATCHES_SUPPORTED pname",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                      ,0x4cc);
      uVar8 = run->n_patch_vertices * 2;
      uVar7 = run->n_patch_vertices * run->drawcall_count_multiplier;
      cVar1 = local_b8[0];
      if (local_b8[0] != '\0') {
        run->n_restart_indices = uVar7 / uVar8;
        uVar7 = uVar7 / uVar8 + uVar7;
      }
      __n = (ulong)uVar7;
      __s = operator_new__(__n);
      memset(__s,0,__n);
      if ((cVar1 != '\0') && (uVar8 < uVar7)) {
        uVar5 = uVar8 | 1;
        do {
          *(undefined1 *)((long)__s + (ulong)uVar8) = 0xff;
          uVar8 = uVar8 + uVar5;
        } while (uVar8 < uVar7);
      }
      (**(code **)(lVar6 + 0x40))(0x8893,run->bo_indices_id);
      this = local_d0;
      dVar4 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar4,"glBindBuffer() failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                      ,0x4fc);
      (**(code **)(lVar6 + 0x150))(0x8893,__n,__s,0x88e4);
      dVar4 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar4,"glBufferData() failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                      ,0x4ff);
      operator_delete__(__s);
    }
    local_b8[0] = '\0';
    local_b8[1] = '\0';
    local_b8[2] = -0x80;
    local_b8[3] = '@';
    local_b8[4] = '\0';
    local_b8[5] = '\0';
    local_b8[6] = -0x80;
    local_b8[7] = '@';
    local_b8[8] = '\0';
    local_b8[9] = '\0';
    local_b8[10] = -0x80;
    local_b8[0xb] = '@';
    local_b8[0xc] = '\0';
    local_b8[0xd] = '\0';
    local_b8[0xe] = -0x80;
    local_b8[0xf] = '@';
    uVar8 = TessellationShaderUtils::getAmountOfVerticesGeneratedByTessellator
                      (this->m_utils_ptr,run->primitive_mode,(float *)local_b8,(float *)local_b8,
                       TESSELLATION_SHADER_VERTEX_SPACING_EQUAL,false);
    run->n_result_vertices = uVar8 * run->drawcall_count_multiplier * run->n_instances;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Program linking failed",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
             ,0x4b8);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::initRun(
	_run& run, _tessellation_primitive_mode primitive_mode, glw::GLint n_patch_vertices, bool is_indiced,
	glw::GLint n_instances, unsigned int drawcall_count_multiplier)
{
	run.drawcall_count_multiplier = drawcall_count_multiplier;
	run.drawcall_is_indiced		  = is_indiced;
	run.n_instances				  = n_instances;
	run.n_patch_vertices		  = n_patch_vertices;
	run.primitive_mode			  = primitive_mode;

	/* Set up a program object for the descriptor */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	run.po_id = gl.createProgram();
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram() failed");

	/* Set up tessellation control shader object */
	std::string tc_body			= getTCCode(n_patch_vertices);
	const char* tc_body_raw_ptr = tc_body.c_str();

	run.tc_id = gl.createShader(m_glExtTokens.TESS_CONTROL_SHADER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() call failed");

	shaderSourceSpecialized(run.tc_id, 1 /* count */, &tc_body_raw_ptr);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() failed for tessellation control shader");

	/* Set up tessellation evaluation shader object. */
	std::string te_body			= getTECode(primitive_mode);
	const char* te_body_raw_ptr = te_body.c_str();

	run.te_id = gl.createShader(m_glExtTokens.TESS_EVALUATION_SHADER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() call failed");

	shaderSourceSpecialized(run.te_id, 1 /* count */, &te_body_raw_ptr);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() failed for tessellation evaluation shader");

	/* Compile the shaders */
	const glw::GLuint  shader_ids[] = { run.tc_id, run.te_id };
	const unsigned int n_shader_ids = sizeof(shader_ids) / sizeof(shader_ids[0]);

	m_utils_ptr->compileShaders(n_shader_ids, shader_ids, true /* should_succeed */);

	/* Attach all shader to the program object */
	gl.attachShader(run.po_id, m_fs_id);
	gl.attachShader(run.po_id, run.te_id);
	gl.attachShader(run.po_id, m_vs_id);
	gl.attachShader(run.po_id, run.tc_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glAttachShader() failed");

	/* Set up XFB */
	const char* varyings[] = { "te_tc_invocation_id", "te_tc_patch_vertices_in", "te_tc_primitive_id",
							   "te_patch_vertices_in", "te_primitive_id" };
	const unsigned int n_varyings = sizeof(varyings) / sizeof(varyings[0]);

	gl.transformFeedbackVaryings(run.po_id, n_varyings, varyings, GL_INTERLEAVED_ATTRIBS);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTransformFeedbackVaryings() failed");

	/* Link the program object */
	glw::GLint link_status = GL_FALSE;

	gl.linkProgram(run.po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glLinkProgram() failed");

	gl.getProgramiv(run.po_id, GL_LINK_STATUS, &link_status);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv() failed");

	if (link_status != GL_TRUE)
	{
		TCU_FAIL("Program linking failed");
	}

	/* If this is going to be an indiced draw call, we need to initialize a buffer
	 * object that will hold index data. GL_UNSIGNED_BYTE index type will be always
	 * used for the purpose of this test.
	 */
	if (is_indiced)
	{
		gl.genBuffers(1, &run.bo_indices_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers() failed");

		/* Implementations are allowed NOT to support primitive restarting for patches.
		 * Take this into account and do not insert restart indices, if ES reports no
		 * support.
		 */
		glw::GLboolean is_primitive_restart_supported = GL_TRUE;

		gl.getBooleanv(GL_PRIMITIVE_RESTART_FOR_PATCHES_SUPPORTED, &is_primitive_restart_supported);
		GLU_EXPECT_NO_ERROR(gl.getError(),
							"glGetIntegerv() failed for GL_PRIMITIVE_RESTART_FOR_PATCHES_SUPPORTED pname");

		/* Set up index buffer storage. Note that we're not using any attributes
		 * in any stage - our goal is just to make sure the primitive counter does
		 * not restart whenever restart index is encountered during a draw call */
		DE_ASSERT(run.n_patch_vertices > 3);
		DE_ASSERT(run.drawcall_count_multiplier > 1);

		const unsigned int interleave_rate = run.n_patch_vertices * 2;
		unsigned char*	 bo_contents	 = DE_NULL;
		unsigned int	   bo_size =
			static_cast<unsigned int>(sizeof(unsigned char) * run.n_patch_vertices * run.drawcall_count_multiplier);

		/* Count in restart indices if necessary */
		if (is_primitive_restart_supported)
		{
			run.n_restart_indices = (bo_size / interleave_rate);
			bo_size += 1 /* restart index */ * run.n_restart_indices;
		}

		/* Allocate space for the index buffer */
		bo_contents = new unsigned char[bo_size];

		/* Interleave the restart index every two complete sets of vertices, each set
		 * making up a full set of vertices. Fill all other indices with zeros. The
		 * indices don't really matter since test shaders do not use any attributes -
		 * what we want to verify is that the restart index does not break the primitive
		 * id counter.
		 *
		 * NOTE: Our interleave rate is just an arbitrary value that makes
		 *       sense, given the multipliers we use for the test */
		const unsigned char restart_index = 0xFF;

		memset(bo_contents, 0, bo_size);

		if (is_primitive_restart_supported)
		{
			for (unsigned int n_index = interleave_rate; n_index < bo_size; n_index += interleave_rate)
			{
				bo_contents[n_index] = restart_index;

				/* Move one index ahead */
				n_index++;
			}
		}

		/* Set up the buffer object storage */
		gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, run.bo_indices_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() failed");

		gl.bufferData(GL_ELEMENT_ARRAY_BUFFER, bo_size, bo_contents, GL_STATIC_DRAW);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData() failed");

		/* Release the buffer */
		delete[] bo_contents;

		bo_contents = NULL;
	}

	/* Retrieve amount of tessellation coordinates.
	 *
	 * Note: this test assumes a constant tessellation level value of 4 for all
	 *       inner/outer tessellation levels */
	const glw::GLfloat tess_levels[] = { 4.0f, 4.0f, 4.0f, 4.0f };

	run.n_result_vertices = m_utils_ptr->getAmountOfVerticesGeneratedByTessellator(
		run.primitive_mode, tess_levels, tess_levels, TESSELLATION_SHADER_VERTEX_SPACING_EQUAL,
		false); /* is_point_mode_enabled */

	/* The value we have at this point is for single patch only. To end up
	 * with actual amount of coordinates that will be generated by the tessellator,
	 * we need to multiply it by drawcall_count_multiplier * n_instances */
	run.n_result_vertices *= run.drawcall_count_multiplier * run.n_instances;

	/* We're done! */
}